

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall
ON_Xform::GetKMLOrientationAnglesDegrees
          (ON_Xform *this,double *heading_degrees,double *tilt_degrees,double *roll_degrees)

{
  bool bVar1;
  double dVar2;
  double dStack_40;
  bool rc;
  double roll_radians;
  double tilt_radians;
  double heading_radians;
  double *roll_degrees_local;
  double *tilt_degrees_local;
  double *heading_degrees_local;
  ON_Xform *this_local;
  
  tilt_radians = ON_DBL_QNAN;
  roll_radians = ON_DBL_QNAN;
  dStack_40 = ON_DBL_QNAN;
  heading_radians = (double)roll_degrees;
  roll_degrees_local = tilt_degrees;
  tilt_degrees_local = heading_degrees;
  heading_degrees_local = (double *)this;
  bVar1 = GetKMLOrientationAnglesRadians(this,&tilt_radians,&roll_radians,&stack0xffffffffffffffc0);
  dVar2 = Internal_RadiansToPrettyKMLDegrees(tilt_radians,0.0);
  *tilt_degrees_local = dVar2;
  dVar2 = Internal_RadiansToPrettyKMLDegrees(roll_radians,-180.0);
  *roll_degrees_local = dVar2;
  dVar2 = Internal_RadiansToPrettyKMLDegrees(dStack_40,-180.0);
  *(double *)heading_radians = dVar2;
  return bVar1;
}

Assistant:

bool ON_Xform::GetKMLOrientationAnglesDegrees(double& heading_degrees, double& tilt_degrees, double& roll_degrees) const
{
  double heading_radians = ON_DBL_QNAN;
  double tilt_radians = ON_DBL_QNAN;
  double roll_radians = ON_DBL_QNAN;
  const bool rc = ON_Xform::GetKMLOrientationAnglesRadians(heading_radians, tilt_radians, roll_radians);
  heading_degrees = Internal_RadiansToPrettyKMLDegrees(heading_radians, 0.0);
  tilt_degrees = Internal_RadiansToPrettyKMLDegrees(tilt_radians, -180.0);
  roll_degrees = Internal_RadiansToPrettyKMLDegrees(roll_radians, -180.0);
  return rc;
}